

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message_field.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::MessageFieldGenerator::GenerateInlineAccessorDefinitions
          (MessageFieldGenerator *this,Printer *printer)

{
  FieldDescriptor *pFVar1;
  Descriptor *pDVar2;
  char *pcVar3;
  char *format_00;
  Formatter format;
  Formatter local_68;
  FieldDescriptor *local_30;
  _func_void_FieldDescriptor_ptr *local_28;
  
  local_68.printer_ = printer;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Rb_tree(&local_68.vars_._M_t,&(this->super_FieldGenerator).variables_._M_t);
  Formatter::operator()<>
            (&local_68,
             "inline const $type$& $classname$::_internal_$name$() const {\n$type_reference_function$  const $type$* p = $casted_member$;\n  return p != nullptr ? *p : reinterpret_cast<const $type$&>(\n      $type_default_instance$);\n}\ninline const $type$& $classname$::$name$() const {\n$annotate_get$  // @@protoc_insertion_point(field_get:$full_name$)\n  return _internal_$name$();\n}\n"
            );
  Formatter::operator()<>
            (&local_68,
             "inline void $classname$::unsafe_arena_set_allocated_$name$(\n    $type$* $name$) {\n  if (GetArenaForAllocation() == nullptr) {\n    delete reinterpret_cast<::$proto_ns$::MessageLite*>($name$_);\n  }\n"
            );
  pcVar3 = "  $name$_ = reinterpret_cast<::$proto_ns$::MessageLite*>($name$);\n";
  format_00 = "  $name$_ = $name$;\n";
  if (this->implicit_weak_field_ == false) {
    pcVar3 = "  $name$_ = $name$;\n";
  }
  Formatter::operator()<>(&local_68,pcVar3);
  Formatter::operator()<>
            (&local_68,
             "  if ($name$) {\n    $set_hasbit$\n  } else {\n    $clear_hasbit$\n  }\n$annotate_set$  // @@protoc_insertion_point(field_unsafe_arena_set_allocated:$full_name$)\n}\n"
            );
  Formatter::operator()<>
            (&local_68,
             "inline $type$* $classname$::$release_name$() {\n$type_reference_function$$annotate_release$  $clear_hasbit$\n  $type$* temp = $casted_member$;\n  $name$_ = nullptr;\n#ifdef PROTOBUF_FORCE_COPY_IN_RELEASE\n  auto* old =  reinterpret_cast<::$proto_ns$::MessageLite*>(temp);\n  temp = ::$proto_ns$::internal::DuplicateIfNonNull(temp);\n  if (GetArenaForAllocation() == nullptr) { delete old; }\n#else  // PROTOBUF_FORCE_COPY_IN_RELEASE\n  if (GetArenaForAllocation() != nullptr) {\n    temp = ::$proto_ns$::internal::DuplicateIfNonNull(temp);\n  }\n#endif  // !PROTOBUF_FORCE_COPY_IN_RELEASE\n  return temp;\n}\ninline $type$* $classname$::unsafe_arena_release_$name$() {\n$annotate_release$  // @@protoc_insertion_point(field_release:$full_name$)\n$type_reference_function$  $clear_hasbit$\n  $type$* temp = $casted_member$;\n  $name$_ = nullptr;\n  return temp;\n}\n"
            );
  Formatter::operator()<>
            (&local_68,
             "inline $type$* $classname$::_internal_mutable_$name$() {\n$type_reference_function$  $set_hasbit$\n  if ($name$_ == nullptr) {\n    auto* p = CreateMaybeMessage<$type$>(GetArenaForAllocation());\n"
            );
  pcVar3 = "    $name$_ = p;\n";
  if (this->implicit_weak_field_ != false) {
    pcVar3 = "    $name$_ = reinterpret_cast<::$proto_ns$::MessageLite*>(p);\n";
  }
  Formatter::operator()<>(&local_68,pcVar3);
  Formatter::operator()<>
            (&local_68,
             "  }\n  return $casted_member$;\n}\ninline $type$* $classname$::mutable_$name$() {\n  $type$* _msg = _internal_mutable_$name$();\n$annotate_mutable$  // @@protoc_insertion_point(field_mutable:$full_name$)\n  return _msg;\n}\n"
            );
  Formatter::operator()<>
            (&local_68,
             "inline void $classname$::set_allocated_$name$($type$* $name$) {\n  ::$proto_ns$::Arena* message_arena = GetArenaForAllocation();\n"
            );
  Formatter::operator()<>(&local_68,"  if (message_arena == nullptr) {\n");
  pFVar1 = (this->super_FieldGenerator).descriptor_;
  if (*(once_flag **)(pFVar1 + 0x18) != (once_flag *)0x0) {
    local_28 = FieldDescriptor::TypeOnceInit;
    local_30 = pFVar1;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(pFVar1 + 0x18),&local_28,&local_30);
  }
  if (pFVar1[2] == (FieldDescriptor)0xb) {
    pDVar2 = FieldDescriptor::message_type(pFVar1);
    if (*(long *)(pDVar2 + 0x10) == *(long *)(pFVar1 + 0x10)) goto LAB_002e3724;
    pcVar3 = "    delete reinterpret_cast< ::$proto_ns$::MessageLite*>($name$_);\n";
  }
  else {
LAB_002e3724:
    pcVar3 = "    delete $name$_;\n";
  }
  Formatter::operator()<>(&local_68,pcVar3);
  Formatter::operator()<>(&local_68,"  }\n  if ($name$) {\n");
  pFVar1 = (this->super_FieldGenerator).descriptor_;
  if (*(once_flag **)(pFVar1 + 0x18) != (once_flag *)0x0) {
    local_28 = FieldDescriptor::TypeOnceInit;
    local_30 = pFVar1;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(pFVar1 + 0x18),&local_28,&local_30);
  }
  if (pFVar1[2] == (FieldDescriptor)0xb) {
    pDVar2 = FieldDescriptor::message_type(pFVar1);
    if (*(long *)(pDVar2 + 0x10) != *(long *)(pFVar1 + 0x10)) {
      pcVar3 = 
      "    ::$proto_ns$::Arena* submessage_arena =\n        ::$proto_ns$::Arena::InternalHelper<\n            ::$proto_ns$::MessageLite>::GetOwningArena(\n                reinterpret_cast<::$proto_ns$::MessageLite*>($name$));\n"
      ;
      goto LAB_002e3797;
    }
  }
  pcVar3 = 
  "    ::$proto_ns$::Arena* submessage_arena =\n        ::$proto_ns$::Arena::InternalHelper<$type$>::GetOwningArena($name$);\n"
  ;
LAB_002e3797:
  Formatter::operator()<>(&local_68,pcVar3);
  Formatter::operator()<>
            (&local_68,
             "    if (message_arena != submessage_arena) {\n      $name$ = ::$proto_ns$::internal::GetOwnedMessage(\n          message_arena, $name$, submessage_arena);\n    }\n    $set_hasbit$\n  } else {\n    $clear_hasbit$\n  }\n"
            );
  if (this->implicit_weak_field_ != false) {
    format_00 = "  $name$_ = reinterpret_cast<MessageLite*>($name$);\n";
  }
  Formatter::operator()<>(&local_68,format_00);
  Formatter::operator()<>
            (&local_68,
             "$annotate_set$  // @@protoc_insertion_point(field_set_allocated:$full_name$)\n}\n");
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_68.vars_._M_t);
  return;
}

Assistant:

void MessageFieldGenerator::GenerateInlineAccessorDefinitions(
    io::Printer* printer) const {
  Formatter format(printer, variables_);
  format(
      "inline const $type$& $classname$::_internal_$name$() const {\n"
      "$type_reference_function$"
      "  const $type$* p = $casted_member$;\n"
      "  return p != nullptr ? *p : reinterpret_cast<const $type$&>(\n"
      "      $type_default_instance$);\n"
      "}\n"
      "inline const $type$& $classname$::$name$() const {\n"
      "$annotate_get$"
      "  // @@protoc_insertion_point(field_get:$full_name$)\n"
      "  return _internal_$name$();\n"
      "}\n");

  format(
      "inline void $classname$::unsafe_arena_set_allocated_$name$(\n"
      "    $type$* $name$) {\n"
      // If we're not on an arena, free whatever we were holding before.
      // (If we are on arena, we can just forget the earlier pointer.)
      "  if (GetArenaForAllocation() == nullptr) {\n"
      "    delete reinterpret_cast<::$proto_ns$::MessageLite*>($name$_);\n"
      "  }\n");
  if (implicit_weak_field_) {
    format(
        "  $name$_ = "
        "reinterpret_cast<::$proto_ns$::MessageLite*>($name$);\n");
  } else {
    format("  $name$_ = $name$;\n");
  }
  format(
      "  if ($name$) {\n"
      "    $set_hasbit$\n"
      "  } else {\n"
      "    $clear_hasbit$\n"
      "  }\n"
      "$annotate_set$"
      "  // @@protoc_insertion_point(field_unsafe_arena_set_allocated"
      ":$full_name$)\n"
      "}\n");
  format(
      "inline $type$* $classname$::$release_name$() {\n"
      "$type_reference_function$"
      "$annotate_release$"
      "  $clear_hasbit$\n"
      "  $type$* temp = $casted_member$;\n"
      "  $name$_ = nullptr;\n"
      "#ifdef PROTOBUF_FORCE_COPY_IN_RELEASE\n"
      "  auto* old =  reinterpret_cast<::$proto_ns$::MessageLite*>(temp);\n"
      "  temp = ::$proto_ns$::internal::DuplicateIfNonNull(temp);\n"
      "  if (GetArenaForAllocation() == nullptr) { delete old; }\n"
      "#else  // PROTOBUF_FORCE_COPY_IN_RELEASE\n"
      "  if (GetArenaForAllocation() != nullptr) {\n"
      "    temp = ::$proto_ns$::internal::DuplicateIfNonNull(temp);\n"
      "  }\n"
      "#endif  // !PROTOBUF_FORCE_COPY_IN_RELEASE\n"
      "  return temp;\n"
      "}\n"
      "inline $type$* $classname$::unsafe_arena_release_$name$() {\n"
      "$annotate_release$"
      "  // @@protoc_insertion_point(field_release:$full_name$)\n"
      "$type_reference_function$"
      "  $clear_hasbit$\n"
      "  $type$* temp = $casted_member$;\n"
      "  $name$_ = nullptr;\n"
      "  return temp;\n"
      "}\n");

  format(
      "inline $type$* $classname$::_internal_mutable_$name$() {\n"
      "$type_reference_function$"
      "  $set_hasbit$\n"
      "  if ($name$_ == nullptr) {\n"
      "    auto* p = CreateMaybeMessage<$type$>(GetArenaForAllocation());\n");
  if (implicit_weak_field_) {
    format("    $name$_ = reinterpret_cast<::$proto_ns$::MessageLite*>(p);\n");
  } else {
    format("    $name$_ = p;\n");
  }
  format(
      "  }\n"
      "  return $casted_member$;\n"
      "}\n"
      "inline $type$* $classname$::mutable_$name$() {\n"
      "  $type$* _msg = _internal_mutable_$name$();\n"
      "$annotate_mutable$"
      "  // @@protoc_insertion_point(field_mutable:$full_name$)\n"
      "  return _msg;\n"
      "}\n");

  // We handle the most common case inline, and delegate less common cases to
  // the slow fallback function.
  format(
      "inline void $classname$::set_allocated_$name$($type$* $name$) {\n"
      "  ::$proto_ns$::Arena* message_arena = GetArenaForAllocation();\n");
  format("  if (message_arena == nullptr) {\n");
  if (IsCrossFileMessage(descriptor_)) {
    format(
        "    delete reinterpret_cast< ::$proto_ns$::MessageLite*>($name$_);\n");
  } else {
    format("    delete $name$_;\n");
  }
  format(
      "  }\n"
      "  if ($name$) {\n");
  if (IsCrossFileMessage(descriptor_)) {
    // We have to read the arena through the virtual method, because the type
    // isn't defined in this file.
    format(
        "    ::$proto_ns$::Arena* submessage_arena =\n"
        "        ::$proto_ns$::Arena::InternalHelper<\n"
        "            ::$proto_ns$::MessageLite>::GetOwningArena(\n"
        "                reinterpret_cast<::$proto_ns$::MessageLite*>("
        "$name$));\n");
  } else {
    format(
        "    ::$proto_ns$::Arena* submessage_arena =\n"
        "        ::$proto_ns$::Arena::InternalHelper<$type$>::GetOwningArena("
        "$name$);\n");
  }
  format(
      "    if (message_arena != submessage_arena) {\n"
      "      $name$ = ::$proto_ns$::internal::GetOwnedMessage(\n"
      "          message_arena, $name$, submessage_arena);\n"
      "    }\n"
      "    $set_hasbit$\n"
      "  } else {\n"
      "    $clear_hasbit$\n"
      "  }\n");
  if (implicit_weak_field_) {
    format("  $name$_ = reinterpret_cast<MessageLite*>($name$);\n");
  } else {
    format("  $name$_ = $name$;\n");
  }
  format(
      "$annotate_set$"
      "  // @@protoc_insertion_point(field_set_allocated:$full_name$)\n"
      "}\n");
}